

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtgc(fitsfile *gfptr,int *xtensionCol,int *extnameCol,int *extverCol,int *positionCol,
          int *locationCol,int *uriCol,int *grptype,int *status)

{
  int iVar1;
  int iVar2;
  char keyvalue [71];
  char comment [73];
  
  if (*status != 0) {
    return *status;
  }
  iVar1 = ffgkys(gfptr,"EXTNAME",keyvalue,comment,status);
  *status = iVar1;
  if (iVar1 == 0xca) {
    *status = 0x154;
    ffpmsg("Specified HDU is not a Grouping Table (ffgtgc)");
    iVar1 = *status;
  }
  if (iVar1 == 0) {
    prepare_keyvalue(keyvalue);
    iVar1 = fits_strcasecmp(keyvalue,"GROUPING");
    if (iVar1 != 0) {
LAB_00171410:
      *status = 0x154;
      return 0x154;
    }
    iVar1 = ffgcno(gfptr,1,"MEMBER_XTENSION",xtensionCol,status);
    *status = iVar1;
    if (iVar1 == 0xdb) {
      *status = 0;
      *xtensionCol = 0;
      iVar1 = *status;
    }
    if (iVar1 == 0) {
      iVar1 = ffgcno(gfptr,1,"MEMBER_NAME",extnameCol,status);
      *status = iVar1;
      if (iVar1 == 0xdb) {
        *status = 0;
        *extnameCol = 0;
        iVar1 = *status;
      }
      if (iVar1 == 0) {
        iVar1 = ffgcno(gfptr,1,"MEMBER_VERSION",extverCol,status);
        *status = iVar1;
        if (iVar1 == 0xdb) {
          *status = 0;
          *extverCol = 0;
          iVar1 = *status;
        }
        if (iVar1 == 0) {
          iVar1 = ffgcno(gfptr,1,"MEMBER_POSITION",positionCol,status);
          *status = iVar1;
          if (iVar1 == 0xdb) {
            *status = 0;
            *positionCol = 0;
            iVar1 = *status;
          }
          if (iVar1 == 0) {
            iVar1 = ffgcno(gfptr,1,"MEMBER_LOCATION",locationCol,status);
            *status = iVar1;
            if (iVar1 == 0xdb) {
              *status = 0;
              *locationCol = 0;
              iVar1 = *status;
            }
            if (iVar1 == 0) {
              iVar2 = 1;
              iVar1 = ffgcno(gfptr,1,"MEMBER_URI_TYPE",uriCol,status);
              *status = iVar1;
              if (iVar1 == 0xdb) {
                *status = 0;
                *uriCol = 0;
                iVar1 = *status;
              }
              if (iVar1 == 0) {
                if (((*xtensionCol == 0) || (*extnameCol == 0)) || (*extverCol == 0)) {
                  if (*positionCol == 0) goto LAB_00171410;
                  if ((*locationCol == 0) || (*uriCol == 0)) {
                    iVar2 = 2;
                  }
                  else {
                    iVar2 = 0xc;
                  }
                }
                else if (*positionCol == 0) {
                  if ((*locationCol != 0) && (*uriCol != 0)) {
                    iVar2 = 0xb;
                  }
                }
                else if ((*locationCol == 0) || (iVar2 = 0, *uriCol == 0)) {
                  iVar2 = 3;
                }
                *grptype = iVar2;
              }
            }
          }
        }
      }
    }
  }
  iVar1 = *status;
  if (iVar1 == 0xed) {
    *status = 0x154;
    ffpmsg("Specified HDU has multipule Group table cols defined (ffgtgc)");
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgtgc(fitsfile *gfptr,  /* pointer to the grouping table                */
	   int *xtensionCol, /* column ID of the MEMBER_XTENSION column      */
	   int *extnameCol,  /* column ID of the MEMBER_NAME column          */
	   int *extverCol,   /* column ID of the MEMBER_VERSION column       */
	   int *positionCol, /* column ID of the MEMBER_POSITION column      */
	   int *locationCol, /* column ID of the MEMBER_LOCATION column      */
	   int *uriCol,      /* column ID of the MEMBER_URI_TYPE column      */
	   int *grptype,     /* group structure type code specifying the
				grouping table columns that are defined:
				GT_ID_ALL_URI  (0) ==> all columns defined   
				GT_ID_REF      (1) ==> reference cols only   
				GT_ID_POS      (2) ==> position col only     
				GT_ID_ALL      (3) ==> ref & pos cols        
				GT_ID_REF_URI (11) ==> ref & loc cols        
				GT_ID_POS_URI (12) ==> pos & loc cols        */
	   int *status)      /* return status code                           */
/*
   examine the grouping table pointed to by gfptr and determine the column
   index ID of each possible grouping column. If a column is not found then
   an index of 0 is returned. the grptype parameter returns the structure
   of the grouping table ==> what columns are defined.
*/

{

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];


  if(*status != 0) return(*status);

  do
    {
      /*
	if the HDU does not have an extname of "GROUPING" then it is not
	a grouping table
      */

      *status = fits_read_key_str(gfptr,"EXTNAME",keyvalue,comment,status);
  
      if(*status == KEY_NO_EXIST) 
	{
	  *status = NOT_GROUP_TABLE;
	  ffpmsg("Specified HDU is not a Grouping Table (ffgtgc)");
	}
      if(*status != 0) continue;

      prepare_keyvalue(keyvalue);

      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
	{
	  *status = NOT_GROUP_TABLE;
	  continue;
	}

      /*
        search for the MEMBER_XTENSION, MEMBER_NAME, MEMBER_VERSION,
	MEMBER_POSITION, MEMBER_LOCATION and MEMBER_URI_TYPE columns
	and determine their column index ID
      */

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_XTENSION",xtensionCol,
				status);

      if(*status == COL_NOT_FOUND)
	{
	  *status      = 0;
 	  *xtensionCol = 0;
	}

      if(*status != 0) continue;

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_NAME",extnameCol,status);

      if(*status == COL_NOT_FOUND)
	{
	  *status     = 0;
	  *extnameCol = 0;
	}

      if(*status != 0) continue;

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_VERSION",extverCol,
				status);

      if(*status == COL_NOT_FOUND)
	{
	  *status    = 0;
	  *extverCol = 0;
	}

      if(*status != 0) continue;

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_POSITION",positionCol,
				status);

      if(*status == COL_NOT_FOUND)
	{
	  *status      = 0;
	  *positionCol = 0;
	}

      if(*status != 0) continue;

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_LOCATION",locationCol,
				status);

      if(*status == COL_NOT_FOUND)
	{
	  *status      = 0;
	  *locationCol = 0;
	}

      if(*status != 0) continue;

      *status = fits_get_colnum(gfptr,CASESEN,"MEMBER_URI_TYPE",uriCol,
				status);

      if(*status == COL_NOT_FOUND)
	{
	  *status = 0;
	  *uriCol = 0;
	}

      if(*status != 0) continue;

      /*
	 determine the type of grouping table structure used by this
	 grouping table and record it in the grptype parameter
      */

      if(*xtensionCol && *extnameCol && *extverCol && *positionCol &&
	 *locationCol && *uriCol) 
	*grptype = GT_ID_ALL_URI;
      
      else if(*xtensionCol && *extnameCol && *extverCol &&
	      *locationCol && *uriCol) 
	*grptype = GT_ID_REF_URI;

      else if(*xtensionCol && *extnameCol && *extverCol && *positionCol)
	*grptype = GT_ID_ALL;
      
      else if(*xtensionCol && *extnameCol && *extverCol)
	*grptype = GT_ID_REF;
      
      else if(*positionCol && *locationCol && *uriCol) 
	*grptype = GT_ID_POS_URI;
      
      else if(*positionCol)
	*grptype = GT_ID_POS;
      
      else
	*status = NOT_GROUP_TABLE;
      
    }while(0);

  /*
    if the table contained more than one column with a reserved name then
    this cannot be considered a vailid grouping table
  */

  if(*status == COL_NOT_UNIQUE) 
    {
      *status = NOT_GROUP_TABLE;
      ffpmsg("Specified HDU has multipule Group table cols defined (ffgtgc)");
    }

  return(*status);
}